

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManPrintNodeProfile(int *pCounts,int nSizeMax)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 0;
  uVar2 = 0;
  for (lVar1 = 0; lVar1 <= nSizeMax; lVar1 = lVar1 + 1) {
    iVar3 = iVar3 + (int)lVar1 * pCounts[lVar1];
    uVar2 = uVar2 + pCounts[lVar1];
  }
  Abc_Print(1,"LUT = %d : ",(ulong)uVar2);
  for (uVar4 = 2; (long)uVar4 <= (long)nSizeMax; uVar4 = uVar4 + 1) {
    Abc_Print(1,"%d=%d %.1f %%  ",((double)pCounts[uVar4] * 100.0) / (double)(int)uVar2,
              uVar4 & 0xffffffff);
  }
  Abc_Print(1,"Ave = %.2f\n",(double)iVar3 / (double)(int)(uVar2 + (uVar2 == 0)));
  return;
}

Assistant:

void Gia_ManPrintNodeProfile( int * pCounts, int nSizeMax )
{
    int i, SizeAll = 0, NodeAll = 0;
    for ( i = 0; i <= nSizeMax; i++ )
    {
        SizeAll += i * pCounts[i];
        NodeAll += pCounts[i];
    }
    Abc_Print( 1, "LUT = %d : ", NodeAll );
    for ( i = 2; i <= nSizeMax; i++ )
        Abc_Print( 1, "%d=%d %.1f %%  ", i, pCounts[i], 100.0*pCounts[i]/NodeAll );
    Abc_Print( 1, "Ave = %.2f\n", 1.0*SizeAll/(NodeAll ? NodeAll : 1) );
}